

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translucent_shader.cpp
# Opt level: O1

void gen_translucent_shade
               (float *ca,float *cr,float *cl,float *cp,float *l,float *e,float *norm,float p,
               float x,float y,float ds,float dd,float depth,float *c)

{
  int i;
  long lVar1;
  int p_00;
  float fVar2;
  float fVar3;
  float fVar4;
  vec3 vrot;
  vec3 ci_total;
  vec3 ci;
  vec3 vthird;
  vec3 vsec;
  float local_b4 [6];
  float local_9c;
  float local_98 [4];
  float *local_88;
  float local_7c;
  float local_78;
  float local_74;
  float *local_70;
  float *local_68;
  float *local_60;
  float local_54 [6];
  float afStack_3c [3];
  
  local_88 = (float *)CONCAT44(local_88._4_4_,p);
  local_9c = dd;
  local_70 = e;
  local_68 = ca;
  local_60 = cr;
  gen_lambert_shade(ca,cr,cl,norm,l,c);
  p_00 = (int)local_88._0_4_;
  local_88 = cp;
  gen_phong_shade(cl,cp,l,local_70,norm,p_00,c);
  lVar1 = 0;
  do {
    c[lVar1] = c[lVar1] * local_9c;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_98[2] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_b4[0] = *norm - ds;
  local_b4[1] = norm[1] - depth;
  local_b4[2] = norm[2];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_b4[lVar1] * local_b4[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    local_b4[lVar1] = local_b4[lVar1] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_74 = local_b4[2];
  local_78 = local_b4[0];
  local_7c = local_b4[1];
  fVar2 = 0.0;
  do {
    local_b4[3] = norm[1] * local_74 - local_7c * norm[2];
    local_b4[4] = norm[2] * local_78 - local_74 * *norm;
    local_b4[5] = *norm * local_7c - local_78 * norm[1];
    fVar3 = sinf(fVar2);
    lVar1 = 0;
    do {
      local_b4[lVar1 + 3] = local_b4[lVar1 + 3] * fVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    fVar3 = cosf(fVar2);
    lVar1 = 0;
    do {
      local_54[lVar1 + 6] = local_b4[lVar1] * fVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    fVar3 = 0.0;
    lVar1 = 0;
    do {
      fVar3 = fVar3 + local_b4[lVar1] * norm[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    fVar4 = cosf(fVar2);
    lVar1 = 0;
    do {
      local_54[lVar1 + 3] = norm[lVar1] * fVar3 * (1.0 - fVar4);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    lVar1 = 0;
    do {
      local_b4[lVar1 + 3] = local_b4[lVar1 + 3] + local_54[lVar1 + 6];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    lVar1 = 0;
    do {
      local_b4[lVar1 + 3] = local_b4[lVar1 + 3] + local_54[lVar1 + 3];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    gen_lambert_shade(local_68,local_60,cl,norm,local_b4 + 3,local_54);
    gen_phong_shade(cl,local_88,local_b4 + 3,local_70,norm,p_00,local_54);
    lVar1 = 0;
    do {
      local_98[lVar1] = local_98[lVar1] + local_54[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    fVar2 = fVar2 + 1.0;
  } while (fVar2 < 6.2831855);
  lVar1 = 0;
  do {
    local_98[lVar1] = local_98[lVar1] * (1.0 - local_9c);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    c[lVar1] = c[lVar1] + local_98[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void gen_translucent_shade(const vec3 ca, const vec3 cr, const vec3 cl, const vec3 cp, vec3 l, const vec3 e, const vec3 norm, const float p,
float x, float y, const float ds, const float dd, const float depth, vec3 c){
    //cal diffuse and spec for inner and outer layer and blend
    gen_lambert_shade(ca, cr, cl, norm, l, c);
    gen_phong_shade(cl, cp, l, e, norm, p, c);
    vec3_scale(c, c, dd); //scale outer color by dimming with depth decay factor
    //apply BTDF to simulate a sum of subsurface source (a forward dipole)
    vec3 ci_total = {0.0f, 0.0f, 0.0f};

    vec3 vbase = {norm[0] - ds, norm[1] - depth, norm[2]}; //pick a subsurface source to start with, set our microfacet dipole to be ds unit away
    vec3_norm(vbase, vbase);
    //approximate an intergral of these subsurface sources
    for(float i = 0.0f; i < 2*PI; i+=1.0f){
        //find rotated vector around the normal by Rodrigue's rotation formula
        vec3 vrot;
        //first term
        vec3_mul_cross(vrot, norm, vbase);
        vec3_scale(vrot, vrot, sin(i));
        //second term
        vec3 vsec;
        vec3_scale(vsec, vbase, cos(i));
        //third term
        vec3 vthird;
        vec3_scale(vthird, norm, vec3_mul_inner(norm, vbase) * (1 - cos(i)) );
        //add and find rotated vec
        vec3_add(vrot, vrot, vsec);
        vec3_add(vrot, vrot, vthird);

        //calculate BTDF for this derivative
        vec3 ci;
        gen_lambert_shade(ca, cr, cl, norm, vrot, ci);
        gen_phong_shade(cl, cp, vrot, e, norm, p, ci);
        vec3_add(ci_total, ci_total, ci);
    }

    vec3_scale(ci_total, ci_total, 1 - dd); //preserve energy by culling with depth decay

    //composite
    vec3_add(c, c, ci_total);
}